

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

Integer ma_table_lookup_assoc(TableData data)

{
  Integer i;
  TableData data_local;
  
  i = 0;
  while( true ) {
    if (ma_table_capacity <= i) {
      return -1;
    }
    if ((ma_table[i].state == TES_Allocated) && (ma_table[i].data == data)) break;
    i = i + 1;
  }
  return i;
}

Assistant:

public Integer ma_table_lookup_assoc(data)
    TableData    data;        /* to lookup */
{
    Integer    i;

    /* perform a linear search from the first table slot */
    for (i = 0; i < ma_table_capacity; i++)
        if ((ma_table[i].state == TES_Allocated) && (ma_table[i].data == data))
            /* success */
            return i;

    /* failure */
    return TABLE_HANDLE_NONE;
}